

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

baseHolder * __thiscall
cs_impl::any::holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_>::duplicate
          (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  baseHolder *pbVar1;
  
  if ((_DAT_002665b8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x58);
  }
  else {
    pbVar1 = *(baseHolder **)(&holder<cs::object_method>::allocator + _DAT_002665b8 * 8);
    _DAT_002665b8 = _DAT_002665b8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_0025c740;
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)(pbVar1 + 1),&this->mDat);
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}